

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O3

void * __thiscall ON_FixedSizePoolIterator::FirstElement(ON_FixedSizePoolIterator *this)

{
  ON_FixedSizePool *pOVar1;
  void *pvVar2;
  
  pOVar1 = this->m_fsp;
  if (((pOVar1 != (ON_FixedSizePool *)0x0) &&
      (pvVar2 = pOVar1->m_first_block, pvVar2 != (void *)0x0)) &&
     (pOVar1->m_total_element_count != 0)) {
    this->m_it_block = pvVar2;
    this->m_it_element = (void *)((long)pvVar2 + 0x10);
    return (void *)((long)pvVar2 + 0x10);
  }
  this->m_it_block = (void *)0x0;
  this->m_it_element = (void *)0x0;
  return (void *)0x0;
}

Assistant:

void* ON_FixedSizePoolIterator::FirstElement()
{
  if ( m_fsp && m_fsp->m_first_block && m_fsp->m_total_element_count > 0 )
  {
    m_it_block = m_fsp->m_first_block;
    m_it_element = (void*)(((char*)m_it_block)+2*sizeof(void*)); // m_it_element points to first element in m_first_block
  }
  else
  {
    m_it_block = 0;
    m_it_element = 0;
  }
  return m_it_element;
}